

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.h
# Opt level: O3

internalJSONNode * __thiscall internalJSONNode::makeUnique(internalJSONNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  size_type __dnew;
  size_type local_40;
  json_string local_38;
  
  uVar2 = this->refcount;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  if (uVar2 < 2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"makeUnique on a 0 refcount internal","");
    JSONDebug::_JSON_ASSERT(uVar2 == 1,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    local_40 = 0x1f;
    local_38._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_38,(ulong)&local_40);
    local_38.field_2._M_allocated_capacity = local_40;
    builtin_strncpy(local_38._M_dataplus._M_p,"decRef on a 0 refcount internal",0x1f);
    local_38._M_string_length = local_40;
    local_38._M_dataplus._M_p[local_40] = '\0';
    JSONDebug::_JSON_ASSERT(true,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    this->refcount = this->refcount - 1;
    this = newInternal(this);
  }
  return this;
}

Assistant:

inline internalJSONNode * internalJSONNode::makeUnique(void) json_nothrow {
    #ifdef JSON_REF_COUNT
	   if (refcount > 1){
		  decRef();
		  return newInternal(*this);
	   }
	   JSON_ASSERT(refcount == 1, JSON_TEXT("makeUnique on a 0 refcount internal"));
	   return this;
    #else
	   return newInternal(*this);
    #endif
}